

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_yang.c
# Opt level: O2

LY_ERR parse_orderedby(lysp_yang_ctx *ctx,lysp_node *llist)

{
  size_t sVar1;
  ushort uVar2;
  LY_ERR LVar3;
  int iVar4;
  char *pcVar5;
  ly_ctx *plVar6;
  bool bVar7;
  ly_stmt kw;
  char *word;
  size_t word_len;
  char *buf;
  
  buf = (char *)0x0;
  if ((llist->flags & 0xc0) != 0) {
    if (ctx == (lysp_yang_ctx *)0x0) {
      plVar6 = (ly_ctx *)0x0;
    }
    else {
      plVar6 = (ly_ctx *)
               **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
    }
    ly_vlog(plVar6,(char *)0x0,LYVE_SYNTAX_YANG,"Duplicate keyword \"%s\".","ordered-by");
    return LY_EVALID;
  }
  LVar3 = get_argument(ctx,Y_STR_ARG,(uint16_t *)0x0,&word,&buf,&word_len);
  sVar1 = word_len;
  if (LVar3 != LY_SUCCESS) goto LAB_0016fe27;
  if (word_len == 4) {
    iVar4 = strncmp(word,"user",4);
    if (iVar4 != 0) goto LAB_0016fddd;
    uVar2 = 0x40;
LAB_0016fe47:
    llist->flags = llist->flags | uVar2;
    LVar3 = get_keyword(ctx,&kw,&word,&word_len);
    if (LVar3 != LY_SUCCESS) goto LAB_0016fe27;
    if (kw == LY_STMT_SYNTAX_SEMICOLON) {
      bVar7 = true;
    }
    else {
      if (kw != LY_STMT_SYNTAX_LEFT_BRACE) {
        if (ctx == (lysp_yang_ctx *)0x0) {
          plVar6 = (ly_ctx *)0x0;
        }
        else {
          plVar6 = (ly_ctx *)
                   **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
        }
        pcVar5 = lyplg_ext_stmt2str(kw);
        ly_vlog(plVar6,(char *)0x0,LYVE_SYNTAX_YANG,
                "Invalid keyword \"%s\", expected \";\" or \"{\".",pcVar5);
        goto LAB_0016fe23;
      }
      LVar3 = get_keyword(ctx,&kw,&word,&word_len);
      if (LVar3 != LY_SUCCESS) goto LAB_0016fe27;
      bVar7 = kw == LY_STMT_SYNTAX_RIGHT_BRACE;
    }
    while (LVar3 = LY_SUCCESS, !bVar7) {
      if (kw != LY_STMT_EXTENSION_INSTANCE) {
        if (ctx == (lysp_yang_ctx *)0x0) {
          plVar6 = (ly_ctx *)0x0;
        }
        else {
          plVar6 = (ly_ctx *)
                   **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
        }
        pcVar5 = lyplg_ext_stmt2str(kw);
        ly_vlog(plVar6,(char *)0x0,LYVE_SYNTAX_YANG,"Invalid keyword \"%s\" as a child of \"%s\".",
                pcVar5,"ordered-by");
        goto LAB_0016fe23;
      }
      LVar3 = parse_ext(ctx,word,word_len,llist,LY_STMT_ORDERED_BY,0,&llist->exts);
      if ((LVar3 != LY_SUCCESS) ||
         (LVar3 = get_keyword(ctx,&kw,&word,&word_len), LVar3 != LY_SUCCESS)) break;
      bVar7 = kw == LY_STMT_SYNTAX_RIGHT_BRACE;
    }
  }
  else {
    if ((word_len == 6) && (iVar4 = strncmp(word,"system",6), iVar4 == 0)) {
      uVar2 = 0x80;
      goto LAB_0016fe47;
    }
LAB_0016fddd:
    if (ctx == (lysp_yang_ctx *)0x0) {
      plVar6 = (ly_ctx *)0x0;
    }
    else {
      plVar6 = (ly_ctx *)
               **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
    }
    ly_vlog(plVar6,(char *)0x0,LYVE_SYNTAX_YANG,"Invalid value \"%.*s\" of \"%s\".",
            sVar1 & 0xffffffff,word,"ordered-by");
LAB_0016fe23:
    LVar3 = LY_EVALID;
  }
LAB_0016fe27:
  free(buf);
  return LVar3;
}

Assistant:

static LY_ERR
parse_orderedby(struct lysp_yang_ctx *ctx, struct lysp_node *llist)
{
    LY_ERR ret = LY_SUCCESS;
    char *buf = NULL, *word;
    size_t word_len;
    enum ly_stmt kw;

    if (llist->flags & LYS_ORDBY_MASK) {
        LOGVAL_PARSER(ctx, LY_VCODE_DUPSTMT, "ordered-by");
        return LY_EVALID;
    }

    /* get value */
    LY_CHECK_GOTO(ret = get_argument(ctx, Y_STR_ARG, NULL, &word, &buf, &word_len), cleanup);

    if ((word_len == ly_strlen_const("system")) && !strncmp(word, "system", word_len)) {
        llist->flags |= LYS_ORDBY_SYSTEM;
    } else if ((word_len == ly_strlen_const("user")) && !strncmp(word, "user", word_len)) {
        llist->flags |= LYS_ORDBY_USER;
    } else {
        LOGVAL_PARSER(ctx, LY_VCODE_INVAL, (int)word_len, word, "ordered-by");
        ret = LY_EVALID;
        goto cleanup;
    }

    YANG_READ_SUBSTMT_FOR_GOTO(ctx, kw, word, word_len, ret, cleanup) {
        switch (kw) {
        case LY_STMT_EXTENSION_INSTANCE:
            LY_CHECK_GOTO(ret = parse_ext(ctx, word, word_len, llist, LY_STMT_ORDERED_BY, 0, &llist->exts), cleanup);
            break;
        default:
            LOGVAL_PARSER(ctx, LY_VCODE_INCHILDSTMT, lyplg_ext_stmt2str(kw), "ordered-by");
            ret = LY_EVALID;
            goto cleanup;
        }
        YANG_READ_SUBSTMT_NEXT_ITER(ctx, kw, word, word_len, NULL, ret, cleanup);
    }

cleanup:
    free(buf);
    return ret;
}